

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O0

void traverse_tree_sim<PredictionData<double,unsigned_long>,long_double>
               (WorkerForSimilarity *workspace,
               PredictionData<double,_unsigned_long> *prediction_data,IsoForest *model_outputs,
               vector<IsoTree,_std::allocator<IsoTree>_> *trees,size_t curr_tree,bool as_kernel)

{
  size_t *psVar1;
  int iVar2;
  pointer pdVar3;
  size_t sVar4;
  longdouble lVar5;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last_00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __result;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __result_00;
  undefined8 uVar6;
  value_type vVar7;
  byte bVar8;
  bool bVar9;
  reference pvVar10;
  unsigned_long *puVar11;
  double *pdVar12;
  reference pvVar13;
  reference pvVar14;
  size_type sVar15;
  IsoForest *in_RCX;
  long lVar16;
  PredictionData<double,_unsigned_long> *in_RDX;
  WorkerForSimilarity *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  vector<IsoTree,_std::allocator<IsoTree>_> *in_R8;
  byte in_R9B;
  uint uVar17;
  longdouble in_ST0;
  double dVar18;
  size_t row_1;
  size_t row;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ix_arr;
  vector<double,_std::allocator<double>_> weights_arr;
  size_t orig_end;
  size_t split_ix;
  size_t end_NA;
  size_t st_NA;
  size_t j_3;
  size_t i_3;
  size_t j__2;
  size_t i__2;
  double w_this_1;
  double *rmat_this_1;
  size_t n_group_1;
  size_t j_2;
  size_t i_2;
  double w_this;
  size_t j__1;
  size_t i__1;
  size_t j_1;
  size_t i_1;
  double *rmat_this;
  size_t n_group;
  size_t j;
  size_t i;
  size_t j_;
  size_t i_;
  longdouble rem;
  undefined4 in_stack_fffffffffffff938;
  undefined4 uVar19;
  undefined4 in_stack_fffffffffffff93c;
  vector<double,_std::allocator<double>_> *this;
  undefined4 uVar20;
  undefined2 in_stack_fffffffffffff940;
  undefined2 in_stack_fffffffffffff942;
  undefined4 in_stack_fffffffffffff944;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffff948;
  undefined4 uVar21;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffff950;
  undefined2 in_stack_fffffffffffff958;
  undefined2 in_stack_fffffffffffff95a;
  MissingAction in_stack_fffffffffffff95c;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffff960;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffff968;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffff970;
  double *in_stack_fffffffffffff978;
  size_t *in_stack_fffffffffffff980;
  size_t *in_stack_fffffffffffff988;
  pointer *this_00;
  size_t *in_stack_fffffffffffff990;
  undefined2 in_stack_fffffffffffff998;
  undefined6 in_stack_fffffffffffff99a;
  double *in_stack_fffffffffffff9a0;
  double *local_5c8;
  double in_stack_fffffffffffffa70;
  unsigned_long *in_stack_fffffffffffffa78;
  double *in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa8c;
  size_t in_stack_fffffffffffffa90;
  pointer puVar22;
  size_t in_stack_fffffffffffffa98;
  pointer puVar23;
  size_t *in_stack_fffffffffffffaa0;
  unsigned_long *in_stack_fffffffffffffab0;
  pointer puVar24;
  MissingAction in_stack_fffffffffffffab8;
  pointer puVar25;
  undefined4 in_stack_fffffffffffffac0;
  MissingAction missing_action;
  undefined4 in_stack_fffffffffffffac4;
  NewCategAction NVar26;
  size_t *in_stack_fffffffffffffac8;
  size_t *in_stack_fffffffffffffad0;
  size_type local_3f0;
  size_type local_348;
  double local_300;
  double *local_2c8;
  double *local_280;
  undefined1 local_200 [152];
  unsigned_long *local_168;
  unsigned_long *local_160;
  unsigned_long *local_158;
  long local_150;
  pointer local_148;
  pointer local_140;
  value_type local_138;
  ulong local_130;
  size_type local_128;
  unsigned_long *local_118;
  unsigned_long *local_110;
  unsigned_long *local_108;
  unsigned_long *local_100;
  pointer local_f8;
  pointer local_f0;
  double *local_e8;
  unsigned_long *local_e0;
  unsigned_long *local_d8;
  unsigned_long *local_d0;
  unsigned_long *local_c8;
  unsigned_long *local_c0;
  unsigned_long *local_b8;
  unsigned_long *local_b0;
  unsigned_long *local_a8;
  long local_a0;
  pointer local_98;
  pointer local_90;
  ulong local_88;
  value_type local_80;
  longdouble local_78;
  unsigned_long *local_68;
  unsigned_long *local_60;
  unsigned_long *local_58;
  unsigned_long *local_50;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffffb8;
  undefined1 uVar27;
  undefined7 in_stack_ffffffffffffffc0;
  
  bVar8 = in_R9B & 1;
  if (interrupt_switch) {
    return;
  }
  if (in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    return;
  }
  bVar9 = std::vector<double,_std::allocator<double>_>::empty
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff950._M_current
                    );
  if (bVar9) {
    local_50 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
    in_stack_ffffffffffffffb8 =
         __gnu_cxx::
         __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
         ::operator+(in_stack_fffffffffffff948._M_current,
                     CONCAT44(in_stack_fffffffffffff944,
                              CONCAT22(in_stack_fffffffffffff942,in_stack_fffffffffffff940)));
    local_68 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
    local_60 = (unsigned_long *)
               __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator+(in_stack_fffffffffffff948._M_current,
                           CONCAT44(in_stack_fffffffffffff944,
                                    CONCAT22(in_stack_fffffffffffff942,in_stack_fffffffffffff940)));
    local_58 = (unsigned_long *)
               __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator+(in_stack_fffffffffffff948._M_current,
                           CONCAT44(in_stack_fffffffffffff944,
                                    CONCAT22(in_stack_fffffffffffff942,in_stack_fffffffffffff940)));
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (in_RDI,(size_type)
                                in_RDI[1].
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
    if (in_RDI[5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage <= (pointer)*pvVar13) {
      return;
    }
    pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (in_RDI,(size_type)
                                in_RDI[1].
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish);
    if ((pointer)*pvVar13 <
        in_RDI[5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      return;
    }
  }
  pvVar10 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                      ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
  if (pvVar10->tree_left == 0) {
    pvVar10 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                        ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
    local_78 = (longdouble)pvVar10->remainder;
    bVar9 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)
                       in_stack_fffffffffffff950._M_current);
    if (!bVar9) {
      if ((bVar8 & 1) == 0) {
        if (((ulong)in_RDI[6].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start & 1) == 0) {
          local_108 = (unsigned_long *)
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
          local_100 = (unsigned_long *)
                      __gnu_cxx::
                      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator+(in_stack_fffffffffffff948._M_current,
                                  CONCAT44(in_stack_fffffffffffff944,
                                           CONCAT22(in_stack_fffffffffffff942,
                                                    in_stack_fffffffffffff940)));
          local_118 = (unsigned_long *)
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
          local_110 = (unsigned_long *)
                      __gnu_cxx::
                      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator+(in_stack_fffffffffffff948._M_current,
                                  CONCAT44(in_stack_fffffffffffff944,
                                           CONCAT22(in_stack_fffffffffffff942,
                                                    in_stack_fffffffffffff940)));
          lVar5 = (longdouble)0;
          in_stack_fffffffffffff938 = SUB104(lVar5,0);
          in_stack_fffffffffffff93c = (undefined4)((unkuint10)lVar5 >> 0x20);
          in_stack_fffffffffffff940 = (undefined2)((unkuint10)lVar5 >> 0x40);
          std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long_double,traverse_tree_sim<PredictionData<double,unsigned_long>,long_double>(WorkerForSimilarity&,PredictionData<double,unsigned_long>&,IsoForest&,std::vector<IsoTree,std::allocator<IsoTree>>&,unsigned_long,bool)::_lambda(long_double,unsigned_long)_1_>
                    (in_stack_fffffffffffff970,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )in_stack_fffffffffffff968._M_current,
                     (longdouble)
                     CONCAT28(in_stack_fffffffffffff958,in_stack_fffffffffffff950._M_current),
                     (anon_class_8_1_57b07335)in_stack_fffffffffffff960._M_current);
          local_78 = local_78 + in_ST0;
        }
        bVar9 = std::vector<double,_std::allocator<double>_>::empty
                          ((vector<double,_std::allocator<double>_> *)
                           in_stack_fffffffffffff950._M_current);
        if (!bVar9) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x43a9c3);
          std::vector<double,_std::allocator<double>_>::data
                    ((vector<double,_std::allocator<double>_> *)0x43aa18);
          std::vector<double,_std::allocator<double>_>::data
                    ((vector<double,_std::allocator<double>_> *)0x43aa31);
          if (((ulong)in_RDI[6].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start & 1) == 0) {
            in_stack_fffffffffffff938 = SUB104(local_78,0);
            in_stack_fffffffffffff93c = (undefined4)((unkuint10)local_78 >> 0x20);
            in_stack_fffffffffffff940 = (undefined2)((unkuint10)local_78 >> 0x40);
            expected_separation_depth<long_double>
                      ((longdouble)CONCAT28(in_stack_fffffffffffff998,in_stack_fffffffffffff990));
          }
          increase_comb_counter
                    ((size_t *)in_stack_fffffffffffff960._M_current,
                     CONCAT44(in_stack_fffffffffffff95c,
                              CONCAT22(in_stack_fffffffffffff95a,in_stack_fffffffffffff958)),
                     (size_t)in_stack_fffffffffffff950._M_current,
                     (size_t)in_stack_fffffffffffff948._M_current,
                     (double *)
                     CONCAT44(in_stack_fffffffffffff944,
                              CONCAT22(in_stack_fffffffffffff942,in_stack_fffffffffffff940)),
                     (double *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                     2.19098993590099e-317);
          return;
        }
        bVar9 = std::vector<double,_std::allocator<double>_>::empty
                          ((vector<double,_std::allocator<double>_> *)
                           in_stack_fffffffffffff950._M_current);
        if (bVar9) {
          return;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x43aae0);
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x43ab4c);
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x43ab65);
        if (((ulong)in_RDI[6].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start & 1) == 0) {
          expected_separation_depth<long_double>
                    ((longdouble)CONCAT28(in_stack_fffffffffffff998,in_stack_fffffffffffff990));
        }
        increase_comb_counter_in_groups
                  (in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988,
                   (size_t)in_stack_fffffffffffff980,(size_t)in_stack_fffffffffffff978,
                   (size_t)in_stack_fffffffffffff970._M_current,in_stack_fffffffffffff968._M_current
                   ,in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff960._M_current);
        return;
      }
      bVar9 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffff950._M_current);
      if (!bVar9) {
        for (local_140 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            local_140 <
            in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish; local_140 = (pointer)((long)local_140 + 1)) {
          pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (in_RDI,(size_type)local_140);
          local_128 = *pvVar13;
          pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)
                               &in_RDI[1].
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,local_128);
          local_138 = *pvVar14;
          local_148 = local_140;
          while (local_148 = (pointer)((long)local_148 + 1),
                local_148 <=
                in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish) {
            pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (in_RDI,(size_type)local_148);
            vVar7 = local_138;
            local_130 = *pvVar13;
            pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 &in_RDI[1].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,local_130);
            dVar18 = *pvVar14;
            if (local_128 < local_130) {
              sVar15 = std::vector<double,_std::allocator<double>_>::size
                                 ((vector<double,_std::allocator<double>_> *)
                                  &in_RDI[3].
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              local_3f0 = (sVar15 + (local_130 - local_128) + -1) -
                          (((long)(in_RSI->ix_arr).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - local_128) *
                           ((long)(in_RSI->ix_arr).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage +
                           (-1 - local_128)) >> 1);
            }
            else {
              sVar15 = std::vector<double,_std::allocator<double>_>::size
                                 ((vector<double,_std::allocator<double>_> *)
                                  &in_RDI[3].
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              local_3f0 = (sVar15 + (local_128 - local_130) + -1) -
                          (((long)(in_RSI->ix_arr).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - local_130) *
                           ((long)(in_RSI->ix_arr).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage +
                           (-1 - local_130)) >> 1);
            }
            pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 &in_RDI[3].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,local_3f0);
            *pvVar14 = vVar7 * dVar18 + *pvVar14;
          }
        }
        return;
      }
      bVar9 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffff950._M_current);
      if (bVar9) {
        return;
      }
      local_160 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
      local_158 = (unsigned_long *)
                  __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator+(in_stack_fffffffffffff948._M_current,
                              CONCAT44(in_stack_fffffffffffff944,
                                       CONCAT22(in_stack_fffffffffffff942,in_stack_fffffffffffff940)
                                      ));
      local_200._136_8_ =
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
      local_200._144_8_ =
           __gnu_cxx::
           __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffff948._M_current,
                       CONCAT44(in_stack_fffffffffffff944,
                                CONCAT22(in_stack_fffffffffffff942,in_stack_fffffffffffff940)));
      local_200._112_8_ =
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
      local_200._120_8_ =
           __gnu_cxx::
           __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffff948._M_current,
                       CONCAT44(in_stack_fffffffffffff944,
                                CONCAT22(in_stack_fffffffffffff942,in_stack_fffffffffffff940)));
      local_200._128_8_ =
           __gnu_cxx::
           __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffff948._M_current,
                       CONCAT44(in_stack_fffffffffffff944,
                                CONCAT22(in_stack_fffffffffffff942,in_stack_fffffffffffff940)));
      local_168 = (unsigned_long *)
                  std::
                  lower_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )in_stack_fffffffffffff968._M_current,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )in_stack_fffffffffffff960._M_current,
                             (unsigned_long *)
                             CONCAT44(in_stack_fffffffffffff95c,
                                      CONCAT22(in_stack_fffffffffffff95a,in_stack_fffffffffffff958))
                            );
      local_150 = std::
                  distance<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            (in_stack_fffffffffffff950,in_stack_fffffffffffff948);
      for (local_200._72_8_ =
                in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
          (ulong)local_200._72_8_ <
          (pointer)((long)in_RDI[1].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start + local_150);
          local_200._72_8_ = local_200._72_8_ + 1) {
        pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (in_RDI,local_200._72_8_);
        local_200._88_8_ = *pvVar13;
        local_200._104_8_ =
             std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x43affb);
        local_200._104_8_ =
             local_200._104_8_ +
             local_200._88_8_ *
             (long)in_RDI[5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage * 8;
        pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)
                             &in_RDI[1].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,local_200._88_8_);
        local_200._96_8_ = *pvVar14;
        for (local_200._64_8_ =
                  (long)in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + local_150;
            (ulong)local_200._64_8_ <=
            in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish; local_200._64_8_ = local_200._64_8_ + 1) {
          pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (in_RDI,local_200._64_8_);
          uVar6 = local_200._96_8_;
          local_200._80_8_ = *pvVar13;
          pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)
                               &in_RDI[1].
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,local_200._80_8_);
          lVar16 = local_200._80_8_ -
                   (long)in_RDI[5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          *(double *)(local_200._104_8_ + lVar16 * 8) =
               (double)uVar6 * *pvVar14 + *(double *)(local_200._104_8_ + lVar16 * 8);
        }
      }
      return;
    }
    if ((bVar8 & 1) != 0) {
      bVar9 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffff950._M_current);
      if (!bVar9) {
        for (local_90 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            local_90 <
            in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish; local_90 = (pointer)((long)local_90 + 1)) {
          pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (in_RDI,(size_type)local_90);
          local_80 = *pvVar13;
          local_98 = local_90;
          while (local_98 = (pointer)((long)local_98 + 1),
                local_98 <=
                in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish) {
            pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (in_RDI,(size_type)local_98);
            local_88 = *pvVar13;
            if (local_80 < local_88) {
              sVar15 = std::vector<double,_std::allocator<double>_>::size
                                 ((vector<double,_std::allocator<double>_> *)
                                  &in_RDI[3].
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              local_348 = (sVar15 + (local_88 - local_80) + -1) -
                          (((long)(in_RSI->ix_arr).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - local_80) *
                           ((long)(in_RSI->ix_arr).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage +
                           (-1 - local_80)) >> 1);
            }
            else {
              sVar15 = std::vector<double,_std::allocator<double>_>::size
                                 ((vector<double,_std::allocator<double>_> *)
                                  &in_RDI[3].
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              local_348 = (sVar15 + (local_80 - local_88) + -1) -
                          (((long)(in_RSI->ix_arr).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - local_88) *
                           ((long)(in_RSI->ix_arr).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage +
                           (-1 - local_88)) >> 1);
            }
            pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 &in_RDI[3].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,local_348);
            *pvVar14 = *pvVar14 + 1.0;
          }
        }
        return;
      }
      bVar9 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffff950._M_current);
      if (bVar9) {
        return;
      }
      local_b0 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
      local_a8 = (unsigned_long *)
                 __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator+(in_stack_fffffffffffff948._M_current,
                             CONCAT44(in_stack_fffffffffffff944,
                                      CONCAT22(in_stack_fffffffffffff942,in_stack_fffffffffffff940))
                            );
      local_c8 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
      local_c0 = (unsigned_long *)
                 __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator+(in_stack_fffffffffffff948._M_current,
                             CONCAT44(in_stack_fffffffffffff944,
                                      CONCAT22(in_stack_fffffffffffff942,in_stack_fffffffffffff940))
                            );
      local_e0 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
      local_d8 = (unsigned_long *)
                 __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator+(in_stack_fffffffffffff948._M_current,
                             CONCAT44(in_stack_fffffffffffff944,
                                      CONCAT22(in_stack_fffffffffffff942,in_stack_fffffffffffff940))
                            );
      local_d0 = (unsigned_long *)
                 __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator+(in_stack_fffffffffffff948._M_current,
                             CONCAT44(in_stack_fffffffffffff944,
                                      CONCAT22(in_stack_fffffffffffff942,in_stack_fffffffffffff940))
                            );
      local_b8 = (unsigned_long *)
                 std::
                 lower_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                           ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )in_stack_fffffffffffff968._M_current,
                            (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )in_stack_fffffffffffff960._M_current,
                            (unsigned_long *)
                            CONCAT44(in_stack_fffffffffffff95c,
                                     CONCAT22(in_stack_fffffffffffff95a,in_stack_fffffffffffff958)))
      ;
      local_a0 = std::
                 distance<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                           (in_stack_fffffffffffff950,in_stack_fffffffffffff948);
      for (local_f0 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          local_f0 <
          (pointer)((long)in_RDI[1].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start + local_a0);
          local_f0 = (pointer)((long)local_f0 + 1)) {
        pdVar12 = std::vector<double,_std::allocator<double>_>::data
                            ((vector<double,_std::allocator<double>_> *)0x43a7be);
        pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (in_RDI,(size_type)local_f0);
        local_e8 = pdVar12 + *pvVar13 *
                             (long)in_RDI[5].
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        for (local_f8 = (pointer)((long)in_RDI[1].
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start + local_a0);
            pdVar12 = local_e8,
            local_f8 <=
            in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish; local_f8 = (pointer)((long)local_f8 + 1)) {
          pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (in_RDI,(size_type)local_f8);
          lVar16 = *pvVar13 -
                   (long)in_RDI[5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pdVar12[lVar16] = pdVar12[lVar16] + 1.0;
        }
      }
      return;
    }
    lVar16 = (long)in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish +
             (1 - (long)in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
    local_78 = local_78 + (longdouble)(float)(&DAT_006c0110)[lVar16 < 0] + (longdouble)lVar16;
    bVar9 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)
                       in_stack_fffffffffffff950._M_current);
    if (!bVar9) {
      puVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x43a25c);
      puVar23 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar22 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
      puVar24 = (in_RSI->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      pdVar12 = std::vector<double,_std::allocator<double>_>::data
                          ((vector<double,_std::allocator<double>_> *)0x43a2b1);
      if (((ulong)in_RDI[6].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start & 1) == 0) {
        local_300 = expected_separation_depth<long_double>
                              ((longdouble)
                               CONCAT28(in_stack_fffffffffffff998,in_stack_fffffffffffff990));
      }
      else {
        local_300 = 3.0;
      }
      increase_comb_counter
                (puVar11,(size_t)puVar23,(size_t)puVar22,(size_t)puVar24,pdVar12,local_300);
      return;
    }
    bVar9 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)
                       in_stack_fffffffffffff950._M_current);
    if (bVar9) {
      return;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x43a358);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x43a3c4);
    if (((ulong)in_RDI[6].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start & 1) == 0) {
      expected_separation_depth<long_double>
                ((longdouble)CONCAT28(in_stack_fffffffffffff998,in_stack_fffffffffffff990));
    }
    increase_comb_counter_in_groups
              (in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988,
               (size_t)in_stack_fffffffffffff980,(size_t)in_stack_fffffffffffff978,
               (size_t)in_stack_fffffffffffff970._M_current,in_stack_fffffffffffff968._M_current,
               (double)in_stack_fffffffffffff960._M_current);
    return;
  }
  if ((in_R8 != (vector<IsoTree,_std::allocator<IsoTree>_> *)0x0) && ((bVar8 & 1) == 0)) {
    bVar9 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)
                       in_stack_fffffffffffff950._M_current);
    if (bVar9) {
      bVar9 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffff950._M_current);
      if (!bVar9) {
        bVar9 = std::vector<double,_std::allocator<double>_>::empty
                          ((vector<double,_std::allocator<double>_> *)
                           in_stack_fffffffffffff950._M_current);
        if (bVar9) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x43b327);
          std::vector<double,_std::allocator<double>_>::data
                    ((vector<double,_std::allocator<double>_> *)0x43b393);
          increase_comb_counter_in_groups
                    (in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988,
                     (size_t)in_stack_fffffffffffff980,(size_t)in_stack_fffffffffffff978,
                     (size_t)in_stack_fffffffffffff970._M_current,
                     in_stack_fffffffffffff968._M_current,
                     (double)in_stack_fffffffffffff960._M_current);
        }
        else {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x43b3dd);
          std::vector<double,_std::allocator<double>_>::data
                    ((vector<double,_std::allocator<double>_> *)0x43b449);
          pdVar12 = std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x43b462);
          in_stack_fffffffffffff938 = SUB84(pdVar12,0);
          in_stack_fffffffffffff93c = (undefined4)((ulong)pdVar12 >> 0x20);
          increase_comb_counter_in_groups
                    (in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988,
                     (size_t)in_stack_fffffffffffff980,(size_t)in_stack_fffffffffffff978,
                     (size_t)in_stack_fffffffffffff970._M_current,
                     in_stack_fffffffffffff968._M_current,in_stack_fffffffffffff9a0,
                     (double)in_stack_fffffffffffff960._M_current);
        }
      }
    }
    else {
      bVar9 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffff950._M_current);
      if (bVar9) {
        puVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x43b1a5);
        puVar23 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar22 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        puVar24 = (in_RSI->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pdVar12 = std::vector<double,_std::allocator<double>_>::data
                            ((vector<double,_std::allocator<double>_> *)0x43b1fa);
        increase_comb_counter(puVar11,(size_t)puVar23,(size_t)puVar22,(size_t)puVar24,pdVar12,-1.0);
      }
      else {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x43b23c);
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x43b291);
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x43b2aa);
        increase_comb_counter
                  ((size_t *)in_stack_fffffffffffff960._M_current,
                   CONCAT44(in_stack_fffffffffffff95c,
                            CONCAT22(in_stack_fffffffffffff95a,in_stack_fffffffffffff958)),
                   (size_t)in_stack_fffffffffffff950._M_current,
                   (size_t)in_stack_fffffffffffff948._M_current,
                   (double *)
                   CONCAT44(in_stack_fffffffffffff944,
                            CONCAT22(in_stack_fffffffffffff942,in_stack_fffffffffffff940)),
                   (double *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                   2.19202401529773e-317);
      }
    }
  }
  if (((in_RSI->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start != (pointer)0x0) &&
     (bVar9 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffff950._M_current), !bVar9)) {
    local_200._48_8_ =
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
    local_200._56_8_ =
         __gnu_cxx::
         __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
         ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)in_stack_fffffffffffff948._M_current,
                     CONCAT44(in_stack_fffffffffffff944,
                              CONCAT22(in_stack_fffffffffffff942,in_stack_fffffffffffff940)));
    local_200._24_8_ =
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
    local_200._32_8_ =
         __gnu_cxx::
         __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
         ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)in_stack_fffffffffffff948._M_current,
                     CONCAT44(in_stack_fffffffffffff944,
                              CONCAT22(in_stack_fffffffffffff942,in_stack_fffffffffffff940)));
    local_200._40_8_ =
         __gnu_cxx::
         __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
         ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)in_stack_fffffffffffff948._M_current,
                     CONCAT44(in_stack_fffffffffffff944,
                              CONCAT22(in_stack_fffffffffffff942,in_stack_fffffffffffff940)));
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  }
  pvVar10 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                      ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
  this = (vector<double,_std::allocator<double>_> *)
         CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938);
  if (pvVar10->col_type == Numeric) {
    if ((in_RSI->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x43b5cc);
      std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
      std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
      this = (vector<double,_std::allocator<double>_> *)(local_200 + 8);
      in_stack_fffffffffffff940 = SUB82(local_200,0);
      in_stack_fffffffffffff942 = (undefined2)((ulong)local_200 >> 0x10);
      in_stack_fffffffffffff944 = (undefined4)((ulong)local_200 >> 0x20);
      divide_subset_split<double>
                (in_stack_fffffffffffff980,in_stack_fffffffffffff978,
                 (size_t)in_stack_fffffffffffff970._M_current,
                 (size_t)in_stack_fffffffffffff968._M_current,
                 (double)in_stack_fffffffffffff960._M_current,in_stack_fffffffffffff95c,
                 in_stack_fffffffffffff950._M_current,in_stack_fffffffffffff990,
                 (size_t *)CONCAT62(in_stack_fffffffffffff99a,in_stack_fffffffffffff998));
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x43b6dd);
      std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
      pdVar3 = (in_RSI->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
      uVar21 = (undefined4)in_RDX->ncols_numeric;
      in_stack_fffffffffffff948._M_current = (unsigned_long *)(local_200 + 0x10);
      in_stack_fffffffffffff950._M_current = (unsigned_long *)(local_200 + 8);
      uVar19 = SUB84(pdVar3,0);
      uVar20 = (undefined4)((ulong)pdVar3 >> 0x20);
      in_stack_fffffffffffff940 = (undefined2)uVar21;
      in_stack_fffffffffffff942 = (undefined2)((uint)uVar21 >> 0x10);
      in_stack_fffffffffffff958 = SUB82(local_200,0);
      in_stack_fffffffffffff95a = (undefined2)((ulong)local_200 >> 0x10);
      in_stack_fffffffffffff95c = (MissingAction)((ulong)local_200 >> 0x20);
      divide_subset_split<double,unsigned_long>
                (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
                 CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                 in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,in_stack_fffffffffffffab0,
                 in_stack_fffffffffffffa70,in_stack_fffffffffffffab8,
                 (size_t *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                 in_stack_fffffffffffffac8,in_stack_fffffffffffffad0);
      this = (vector<double,_std::allocator<double>_> *)CONCAT44(uVar20,uVar19);
    }
  }
  else if (pvVar10->col_type == Categorical) {
    if (*(int *)&in_RDX->field_0x1c == 0) {
      pvVar10 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                          ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
      NVar26 = (NewCategAction)in_stack_fffffffffffff970._M_current;
      uVar21 = (undefined4)((ulong)in_stack_fffffffffffff948._M_current >> 0x20);
      sVar15 = std::vector<signed_char,_std::allocator<signed_char>_>::size(&pvVar10->cat_split);
      if (sVar15 == 0) {
        puVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x43b96c);
        puVar23 = (in_RSI->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        puVar22 = (in_RSI->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pvVar10 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                            ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
        sVar4 = pvVar10->col_num;
        puVar24 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar25 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        missing_action = (MissingAction)in_RDX->ncols_numeric;
        NVar26 = *(NewCategAction *)&in_RDX->is_col_major;
        pvVar10 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                            ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
        bVar9 = pvVar10->pct_tree_left <= 0.5 && pvVar10->pct_tree_left != 0.5;
        in_stack_fffffffffffff950._M_current = (unsigned_long *)local_200;
        in_stack_fffffffffffff948._M_current = (unsigned_long *)(local_200 + 8);
        psVar1 = (size_t *)(local_200 + 0x10);
        in_stack_fffffffffffff940 = SUB82(psVar1,0);
        in_stack_fffffffffffff942 = (undefined2)((ulong)psVar1 >> 0x10);
        in_stack_fffffffffffff944 = (undefined4)((ulong)psVar1 >> 0x20);
        uVar17 = (uint)bVar9;
        divide_subset_split(puVar11,(int *)((long)puVar23 + (long)puVar22 * sVar4 * 4),
                            (size_t)puVar24,(size_t)puVar25,missing_action,NVar26,bVar9,psVar1,
                            in_stack_fffffffffffff948._M_current,
                            in_stack_fffffffffffff950._M_current);
      }
      else {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x43bac3);
        std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                  ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
        std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                  ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
        std::vector<signed_char,_std::allocator<signed_char>_>::data
                  ((vector<signed_char,_std::allocator<signed_char>_> *)0x43bb78);
        pvVar10 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                            ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
        std::vector<signed_char,_std::allocator<signed_char>_>::size(&pvVar10->cat_split);
        uVar17 = (uint)in_RDX->ncols_numeric;
        uVar19 = *(undefined4 *)&in_RDX->is_col_major;
        pvVar10 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                            ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
        in_stack_fffffffffffff960._M_current = (double *)local_200;
        psVar1 = (size_t *)(local_200 + 8);
        in_stack_fffffffffffff958 = SUB82(psVar1,0);
        in_stack_fffffffffffff95a = (undefined2)((ulong)psVar1 >> 0x10);
        in_stack_fffffffffffff95c = (MissingAction)((ulong)psVar1 >> 0x20);
        in_stack_fffffffffffff950._M_current = (unsigned_long *)(local_200 + 0x10);
        in_stack_fffffffffffff940 = (undefined2)uVar19;
        in_stack_fffffffffffff942 = (undefined2)((uint)uVar19 >> 0x10);
        in_stack_fffffffffffff948._M_current =
             (unsigned_long *)
             CONCAT44(uVar21,(uint)(pvVar10->pct_tree_left <= 0.5 && pvVar10->pct_tree_left != 0.5))
        ;
        divide_subset_split(psVar1,(int *)in_stack_fffffffffffff950._M_current,
                            (size_t)in_stack_fffffffffffff948._M_current,
                            CONCAT44(in_stack_fffffffffffff944,uVar19),
                            (char *)CONCAT44(in_stack_fffffffffffff93c,uVar17),0,
                            (MissingAction)in_stack_fffffffffffff968._M_current,NVar26,false,
                            in_stack_fffffffffffff980,in_stack_fffffffffffff988,
                            in_stack_fffffffffffff990);
      }
      this = (vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_fffffffffffff93c,uVar17);
    }
    else if (*(int *)&in_RDX->field_0x1c == 0x29) {
      puVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x43b82b);
      puVar23 = (in_RSI->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      puVar22 = (in_RSI->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar10 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                          ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
      sVar4 = pvVar10->col_num;
      puVar24 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar25 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pvVar10 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                          ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
      this = (vector<double,_std::allocator<double>_> *)(local_200 + 0x10);
      psVar1 = (size_t *)(local_200 + 8);
      in_stack_fffffffffffff948._M_current = (unsigned_long *)local_200;
      in_stack_fffffffffffff940 = SUB82(psVar1,0);
      in_stack_fffffffffffff942 = (undefined2)((ulong)psVar1 >> 0x10);
      in_stack_fffffffffffff944 = (undefined4)((ulong)psVar1 >> 0x20);
      divide_subset_split(puVar11,(int *)((long)puVar23 + (long)puVar22 * sVar4 * 4),(size_t)puVar24
                          ,(size_t)puVar25,pvVar10->chosen_cat,(MissingAction)in_RDX->ncols_numeric,
                          (size_t *)this,psVar1,in_stack_fffffffffffff948._M_current);
    }
  }
  uVar27 = (undefined1)((ulong)in_stack_ffffffffffffffb8._M_current >> 0x38);
  pdVar12 = (double *)
            in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (((*(int *)&in_RDX->is_col_major == 0) && (*(int *)&in_RDX->field_0x1c == 0)) &&
     ((in_RSI->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0)) {
    if (((int)in_RDX->ncols_numeric == 0) &&
       (pvVar10 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                            ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8),
       pvVar10->col_type == Numeric)) {
      local_200._16_8_ = local_200._0_8_;
      local_200._8_8_ = local_200._0_8_;
    }
LAB_0043bf1a:
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x43bf27);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x43bf34);
    if (in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < (ulong)local_200._8_8_) {
      std::vector<double,_std::allocator<double>_>::begin(this);
      std::vector<double,_std::allocator<double>_>::begin(this);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_stack_fffffffffffff948._M_current,
                CONCAT44(in_stack_fffffffffffff944,
                         CONCAT22(in_stack_fffffffffffff942,in_stack_fffffffffffff940)));
      __last._M_current._2_2_ = in_stack_fffffffffffff95a;
      __last._M_current._0_2_ = in_stack_fffffffffffff958;
      __last._M_current._4_4_ = in_stack_fffffffffffff95c;
      std::vector<double,std::allocator<double>>::
      assign<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff950._M_current,
                 in_stack_fffffffffffff960,__last);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   *)in_stack_fffffffffffff948._M_current,
                  CONCAT44(in_stack_fffffffffffff944,
                           CONCAT22(in_stack_fffffffffffff942,in_stack_fffffffffffff940)));
      __last_00._M_current._2_2_ = in_stack_fffffffffffff95a;
      __last_00._M_current._0_2_ = in_stack_fffffffffffff958;
      __last_00._M_current._4_4_ = in_stack_fffffffffffff95c;
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffff950._M_current,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )in_stack_fffffffffffff960._M_current,__last_00);
    }
    if (in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < (ulong)local_200._8_8_) {
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(local_200._8_8_ + -1);
      for (local_280 = (double *)local_200._16_8_; local_280 < (ulong)local_200._8_8_;
          local_280 = (double *)((long)local_280 + 1)) {
        pvVar10 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                            ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
        dVar18 = pvVar10->pct_tree_left;
        pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (in_RDI,(size_type)local_280);
        pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)
                             &in_RDI[1].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,*pvVar13);
        *pvVar14 = dVar18 * *pvVar14;
      }
      std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
      traverse_tree_sim<PredictionData<double,unsigned_long>,long_double>
                (in_RSI,in_RDX,in_RCX,in_R8,CONCAT17(bVar8,in_stack_ffffffffffffffc0),
                 SUB81((ulong)in_stack_ffffffffffffffb8._M_current >> 0x38,0));
    }
    if ((ulong)local_200._16_8_ <= pdVar12) {
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_200._16_8_;
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pdVar12;
      bVar9 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffff950._M_current);
      if (!bVar9) {
        std::vector<double,_std::allocator<double>_>::begin(this);
        std::vector<double,_std::allocator<double>_>::end(this);
        std::vector<double,_std::allocator<double>_>::begin(this);
        __result._M_current._2_2_ = in_stack_fffffffffffff95a;
        __result._M_current._0_2_ = in_stack_fffffffffffff958;
        __result._M_current._4_4_ = in_stack_fffffffffffff95c;
        std::
        copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                  (in_stack_fffffffffffff968,in_stack_fffffffffffff960,__result);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
        __result_00._M_current._2_2_ = in_stack_fffffffffffff95a;
        __result_00._M_current._0_2_ = in_stack_fffffffffffff958;
        __result_00._M_current._4_4_ = in_stack_fffffffffffff95c;
        std::
        copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )in_stack_fffffffffffff968._M_current,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )in_stack_fffffffffffff960._M_current,__result_00);
        std::vector<double,_std::allocator<double>_>::clear
                  ((vector<double,_std::allocator<double>_> *)0x43c315);
        std::vector<double,_std::allocator<double>_>::shrink_to_fit
                  ((vector<double,_std::allocator<double>_> *)0x43c31f);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x43c333);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::shrink_to_fit
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x43c33d);
      }
      for (local_2c8 = (double *)local_200._16_8_;
          uVar27 = (undefined1)((ulong)in_stack_ffffffffffffffb8._M_current >> 0x38),
          local_2c8 < (ulong)local_200._8_8_; local_2c8 = (double *)((long)local_2c8 + 1)) {
        pvVar10 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                            ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
        dVar18 = 1.0 - pvVar10->pct_tree_left;
        this_00 = &in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (in_RDI,(size_type)local_2c8);
        pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)this_00,*pvVar13);
        *pvVar14 = dVar18 * *pvVar14;
      }
      std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
      traverse_tree_sim<PredictionData<double,unsigned_long>,long_double>
                (in_RSI,in_RDX,in_RCX,in_R8,CONCAT17(bVar8,in_stack_ffffffffffffffc0),(bool)uVar27);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffff950._M_current);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff950._M_current);
  }
  else {
    iVar2 = (int)in_RDX->ncols_numeric;
    if (iVar2 != 0) {
      if (iVar2 == 0x15) goto LAB_0043bf1a;
      if (iVar2 != 0x16) {
        return;
      }
      pvVar10 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                          ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
      if (pvVar10->pct_tree_left < 0.5) {
        local_5c8 = (double *)local_200._16_8_;
      }
      else {
        local_5c8 = (double *)local_200._8_8_;
      }
      local_200._0_8_ = local_5c8;
    }
    if (in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < (ulong)local_200._0_8_) {
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(local_200._0_8_ + -1);
      std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
      traverse_tree_sim<PredictionData<double,unsigned_long>,long_double>
                (in_RSI,in_RDX,in_RCX,in_R8,CONCAT17(bVar8,in_stack_ffffffffffffffc0),(bool)uVar27);
    }
    if ((ulong)local_200._0_8_ <= pdVar12) {
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_200._0_8_;
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pdVar12;
      std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RCX,(size_type)in_R8);
      traverse_tree_sim<PredictionData<double,unsigned_long>,long_double>
                (in_RSI,in_RDX,in_RCX,in_R8,CONCAT17(bVar8,in_stack_ffffffffffffffc0),(bool)uVar27);
    }
  }
  return;
}

Assistant:

void traverse_tree_sim(WorkerForSimilarity   &workspace,
                       PredictionData        &prediction_data,
                       IsoForest             &model_outputs,
                       std::vector<IsoTree>  &trees,
                       size_t                curr_tree,
                       const bool            as_kernel)
{
    if (interrupt_switch)
        return;

    if (workspace.st == workspace.end)
        return;

    if (workspace.tmat_sep.empty())
    {
        std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);
        if (workspace.ix_arr[workspace.st] >= workspace.n_from)
            return;
        if (workspace.ix_arr[workspace.end] < workspace.n_from)
            return;
    }

    /* Note: the first separation step will not be added here, as it simply consists of adding +1
       to every combination regardless. It has to be added at the end in 'gather_sim_result' to
       obtain the average separation depth. */
    if (trees[curr_tree].tree_left == 0)
    {
        ldouble_safe rem = (ldouble_safe) trees[curr_tree].remainder;
        if (workspace.weights_arr.empty())
        {
            if (!as_kernel)
            {
                rem += (ldouble_safe)(workspace.end - workspace.st + 1);
                if (!workspace.tmat_sep.empty())
                    increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                          prediction_data.nrows, workspace.tmat_sep.data(),
                                          workspace.assume_full_distr? 3. : expected_separation_depth(rem));
                else if (!workspace.rmat.empty())
                    increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end,
                                                    workspace.n_from, prediction_data.nrows, workspace.rmat.data(),
                                                    workspace.assume_full_distr? 3. : expected_separation_depth(rem));
            }

            else
            {
                if (!workspace.tmat_sep.empty())
                {
                    size_t i_, j_;
                    for (size_t i = workspace.st; i < workspace.end; i++)
                    {
                        i_ = workspace.ix_arr[i];
                        for (size_t j = i + 1; j <= workspace.end; j++)
                        {
                            j_ = workspace.ix_arr[j];
                            workspace.tmat_sep[ix_comb(i_, j_, prediction_data.nrows, workspace.tmat_sep.size())]++;
                        }
                    }
                }

                else if (!workspace.rmat.empty())
                {
                    size_t n_group = std::distance(workspace.ix_arr.begin() + workspace.st,
                                                   std::lower_bound(workspace.ix_arr.begin() + workspace.st,
                                                                    workspace.ix_arr.begin() + workspace.end + 1,
                                                                    workspace.n_from));
                    double *restrict rmat_this;
                    for (size_t i = workspace.st; i < workspace.st + n_group; i++)
                    {
                        rmat_this = workspace.rmat.data() + workspace.ix_arr[i]*workspace.n_from;
                        for (size_t j = workspace.st + n_group; j <= workspace.end; j++)
                        {
                            rmat_this[workspace.ix_arr[j] - workspace.n_from]++;
                        }
                    }
                }
            }
        }

        else
        {
            if (!as_kernel)
            {
                if (!workspace.assume_full_distr)
                {
                    rem += std::accumulate(workspace.ix_arr.begin() + workspace.st,
                                           workspace.ix_arr.begin() + workspace.end,
                                           (ldouble_safe) 0.,
                                           [&workspace](ldouble_safe curr, size_t ix)
                                           {return curr + (ldouble_safe)workspace.weights_arr[ix];}
                                          );
                }

                if (!workspace.tmat_sep.empty())
                    increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                          prediction_data.nrows, workspace.tmat_sep.data(),
                                          workspace.weights_arr.data(),
                                          workspace.assume_full_distr? 3. : expected_separation_depth(rem));
                else if (!workspace.rmat.empty())
                    increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end,
                                                    workspace.n_from, prediction_data.nrows,
                                                    workspace.rmat.data(), workspace.weights_arr.data(),
                                                    workspace.assume_full_distr? 3. : expected_separation_depth(rem));
            }

            else
            {
                if (!workspace.tmat_sep.empty())
                {
                    size_t i_, j_;
                    double w_this;
                    for (size_t i = workspace.st; i < workspace.end; i++)
                    {
                        i_ = workspace.ix_arr[i];
                        w_this = workspace.weights_arr[i_];
                        for (size_t j = i + 1; j <= workspace.end; j++)
                        {
                            j_ = workspace.ix_arr[j];
                            workspace.tmat_sep[ix_comb(i_, j_, prediction_data.nrows, workspace.tmat_sep.size())]
                                +=
                            w_this * workspace.weights_arr[j_];
                        }
                    }
                }

                else if (!workspace.rmat.empty())
                {
                    size_t n_group = std::distance(workspace.ix_arr.begin() + workspace.st,
                                                   std::lower_bound(workspace.ix_arr.begin() + workspace.st,
                                                                    workspace.ix_arr.begin() + workspace.end + 1,
                                                                    workspace.n_from));
                    double *restrict rmat_this;
                    double w_this;
                    size_t i_, j_;
                    for (size_t i = workspace.st; i < workspace.st + n_group; i++)
                    {
                        i_ = workspace.ix_arr[i];
                        rmat_this = workspace.rmat.data() + i_*workspace.n_from;
                        w_this = workspace.weights_arr[i_];
                        for (size_t j = workspace.st + n_group; j <= workspace.end; j++)
                        {
                            j_ = workspace.ix_arr[j];
                            rmat_this[j_ - workspace.n_from]
                                +=
                            w_this * workspace.weights_arr[j_];
                        }
                    }
                }
            }
        }
        return;
    }

    else if (curr_tree > 0 && !as_kernel)
    {
        if (!workspace.tmat_sep.empty())
        {
            if (workspace.weights_arr.empty())
                increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                      prediction_data.nrows, workspace.tmat_sep.data(), -1.);
            else
                increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                      prediction_data.nrows, workspace.tmat_sep.data(),
                                      workspace.weights_arr.data(), -1.);
        }
        else if (!workspace.rmat.empty())
        {
            if (workspace.weights_arr.empty())
                increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end,
                                                workspace.n_from, prediction_data.nrows, workspace.rmat.data(), -1.);
            else
                increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end,
                                                workspace.n_from, prediction_data.nrows,
                                                workspace.rmat.data(), workspace.weights_arr.data(), -1.);
        }
    }


    /* divide according to tree */
    if (prediction_data.Xc_indptr != NULL && !workspace.tmat_sep.empty())
        std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);
    size_t st_NA, end_NA, split_ix;
    switch (trees[curr_tree].col_type)
    {
        case Numeric:
        {
            if (prediction_data.Xc_indptr == NULL)
                divide_subset_split(workspace.ix_arr.data(),
                                    prediction_data.numeric_data + prediction_data.nrows * trees[curr_tree].col_num,
                                    workspace.st, workspace.end, trees[curr_tree].num_split,
                                    model_outputs.missing_action, st_NA, end_NA, split_ix);
            else
                divide_subset_split(workspace.ix_arr.data(), workspace.st, workspace.end, trees[curr_tree].col_num,
                                    prediction_data.Xc, prediction_data.Xc_ind, prediction_data.Xc_indptr,
                                    trees[curr_tree].num_split, model_outputs.missing_action,
                                    st_NA, end_NA, split_ix);
            break;
        }

        case Categorical:
        {
            switch(model_outputs.cat_split_type)
            {
                case SingleCateg:
                {
                    divide_subset_split(workspace.ix_arr.data(),
                                        prediction_data.categ_data + prediction_data.nrows * trees[curr_tree].col_num,
                                        workspace.st, workspace.end, trees[curr_tree].chosen_cat,
                                         model_outputs.missing_action, st_NA, end_NA, split_ix);
                    break;
                }

                case SubSet:
                {
                    if (!trees[curr_tree].cat_split.size())
                        divide_subset_split(workspace.ix_arr.data(),
                                            prediction_data.categ_data + prediction_data.nrows * trees[curr_tree].col_num,
                                            workspace.st, workspace.end,
                                            model_outputs.missing_action, model_outputs.new_cat_action,
                                            trees[curr_tree].pct_tree_left < .5, st_NA, end_NA, split_ix);
                    else
                        divide_subset_split(workspace.ix_arr.data(),
                                            prediction_data.categ_data + prediction_data.nrows * trees[curr_tree].col_num,
                                            workspace.st, workspace.end, trees[curr_tree].cat_split.data(),
                                            (int) trees[curr_tree].cat_split.size(),
                                            model_outputs.missing_action, model_outputs.new_cat_action,
                                            (bool)(trees[curr_tree].pct_tree_left < .5), st_NA, end_NA, split_ix);
                    break;
                }
            }
            break;
        }

        default:
        {
            assert(0);
            break;
        }
    }


    /* continue splitting recursively */
    size_t orig_end = workspace.end;
    if (model_outputs.new_cat_action == Weighted && model_outputs.cat_split_type == SubSet && prediction_data.categ_data != NULL) {
        if (model_outputs.missing_action == Fail && trees[curr_tree].col_type == Numeric) {
            st_NA = split_ix;
            end_NA = split_ix;
        }
        goto missing_action_divide;
    }
    switch (model_outputs.missing_action)
    {
        case Impute:
        {
            split_ix = (trees[curr_tree].pct_tree_left >= .5)? end_NA : st_NA;
        }

        case Fail:
        {
            if (split_ix > workspace.st)
            {
                workspace.end = split_ix - 1;
                traverse_tree_sim<PredictionData, ldouble_safe>(
                                  workspace,
                                  prediction_data,
                                  model_outputs,
                                  trees,
                                  trees[curr_tree].tree_left,
                                  as_kernel);
            }


            if (split_ix <= orig_end)
            {
                workspace.st  = split_ix;
                workspace.end = orig_end;
                traverse_tree_sim<PredictionData, ldouble_safe>(
                                  workspace,
                                  prediction_data,
                                  model_outputs,
                                  trees,
                                  trees[curr_tree].tree_right,
                                  as_kernel);
            }
            break;
        }

        case Divide: /* new_cat_action = 'Weighted' will also fall here */
        {
            /* TODO: this one should also have a parameter 'changed_weoghts' like during fitting */
            missing_action_divide:
          /* TODO: maybe here it shouldn't copy the whole ix_arr,
             but then it'd need to re-generate it from outside too */
            std::vector<double> weights_arr;
            std::vector<size_t> ix_arr;
            if (end_NA > workspace.st)
            {
                weights_arr.assign(workspace.weights_arr.begin(),
                                   workspace.weights_arr.begin() + end_NA);
                ix_arr.assign(workspace.ix_arr.begin(),
                              workspace.ix_arr.begin() + end_NA);
            }

            if (end_NA > workspace.st)
            {
                workspace.end = end_NA - 1;
                for (size_t row = st_NA; row < end_NA; row++)
                    workspace.weights_arr[workspace.ix_arr[row]] *= trees[curr_tree].pct_tree_left;
                traverse_tree_sim<PredictionData, ldouble_safe>(
                                  workspace,
                                  prediction_data,
                                  model_outputs,
                                  trees,
                                  trees[curr_tree].tree_left,
                                  as_kernel);
            }

            if (st_NA <= orig_end)
            {
                workspace.st = st_NA;
                workspace.end = orig_end;
                if (!weights_arr.empty())
                {
                    std::copy(weights_arr.begin(),
                              weights_arr.end(),
                              workspace.weights_arr.begin());
                    std::copy(ix_arr.begin(),
                              ix_arr.end(),
                              workspace.ix_arr.begin());
                    weights_arr.clear();
                    weights_arr.shrink_to_fit();
                    ix_arr.clear();
                    ix_arr.shrink_to_fit();
                }

                for (size_t row = st_NA; row < end_NA; row++)
                    workspace.weights_arr[workspace.ix_arr[row]] *= (1. - trees[curr_tree].pct_tree_left);
                traverse_tree_sim<PredictionData, ldouble_safe>(
                                  workspace,
                                  prediction_data,
                                  model_outputs,
                                  trees,
                                  trees[curr_tree].tree_right,
                                  as_kernel);
            }
            break;
        }
    }
}